

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O1

Name wasm::Name::fromInt(size_t i)

{
  bool bVar1;
  size_type *psVar2;
  char cVar3;
  IString *this;
  undefined1 reuse;
  size_t in_RCX;
  ulong uVar4;
  char cVar5;
  string_view sVar6;
  size_type *local_40;
  string __str;
  
  cVar5 = '\x01';
  if (9 < i) {
    in_RCX = i;
    cVar3 = '\x04';
    do {
      cVar5 = cVar3;
      if (in_RCX < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_005d3edc;
      }
      if (in_RCX < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_005d3edc;
      }
      if (in_RCX < 10000) goto LAB_005d3edc;
      uVar4 = in_RCX / 10000;
      bVar1 = 99999 < in_RCX;
      in_RCX = uVar4;
      cVar3 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_005d3edc:
  reuse = (undefined1)in_RCX;
  local_40 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,(uint)__str._M_dataplus._M_p,i);
  psVar2 = local_40;
  this = (IString *)strlen((char *)local_40);
  sVar6._M_str = (char *)0x0;
  sVar6._M_len = (size_t)psVar2;
  sVar6 = IString::interned(this,sVar6,(bool)reuse);
  if (local_40 != &__str._M_string_length) {
    operator_delete(local_40,__str._M_string_length + 1);
  }
  return (IString)(IString)sVar6;
}

Assistant:

static Name fromInt(size_t i) {
    return IString(std::to_string(i).c_str(), false);
  }